

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManEquivReduce2(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  void *__s;
  Gia_Rpr_t *pGVar3;
  int *piVar4;
  Vec_Int_t *vMap_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int *pMap;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vMap;
  Gia_Man_t *p_local;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) && (p->pSibls != (int *)0x0)) {
    iVar1 = Gia_ManObjNum(p);
    __s = malloc((long)iVar1 << 2);
    iVar1 = Gia_ManObjNum(p);
    memset(__s,0xff,(long)iVar1 << 2);
    iVar1 = Gia_ManObjNum(p);
    pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    p->pReprs = pGVar3;
    for (pMap._4_4_ = 0; iVar1 = Gia_ManObjNum(p), pMap._4_4_ < iVar1; pMap._4_4_ = pMap._4_4_ + 1)
    {
      Gia_ObjSetRepr(p,pMap._4_4_,0xfffffff);
    }
    for (pMap._4_4_ = 0; iVar1 = Gia_ManObjNum(p), pMap._4_4_ < iVar1; pMap._4_4_ = pMap._4_4_ + 1)
    {
      if (0 < p->pSibls[pMap._4_4_]) {
        if (*(int *)((long)__s + (long)p->pSibls[pMap._4_4_] * 4) == -1) {
          *(int *)((long)__s + (long)p->pSibls[pMap._4_4_] * 4) = p->pSibls[pMap._4_4_];
        }
        *(undefined4 *)((long)__s + (long)pMap._4_4_ * 4) =
             *(undefined4 *)((long)__s + (long)p->pSibls[pMap._4_4_] * 4);
      }
    }
    for (pMap._4_4_ = 0; iVar1 = Gia_ManObjNum(p), pMap._4_4_ < iVar1; pMap._4_4_ = pMap._4_4_ + 1)
    {
      if (0 < p->pSibls[pMap._4_4_]) {
        Gia_ObjSetRepr(p,pMap._4_4_,*(int *)((long)__s + (long)pMap._4_4_ * 4));
      }
    }
    if (p->pNexts != (int *)0x0) {
      free(p->pNexts);
      p->pNexts = (int *)0x0;
    }
    piVar4 = Gia_ManDeriveNexts(p);
    p->pNexts = piVar4;
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManEquivReduce(): Equivalence classes are not available.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    pMap._4_4_ = 0;
    while( true ) {
      bVar7 = false;
      if (pMap._4_4_ < p->nObjs) {
        pGStack_30 = Gia_ManObj(p,pMap._4_4_);
        bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
      if ((!bVar7) || (pGVar6 = Gia_ObjReprObj(p,pMap._4_4_), pGVar6 != (Gia_Obj_t *)0x0)) break;
      pMap._4_4_ = pMap._4_4_ + 1;
    }
    iVar1 = Gia_ManObjNum(p);
    if (pMap._4_4_ == iVar1) {
      p_local = Gia_ManDup(p);
    }
    else {
      vMap_00 = Gia_ManChoiceMinLevel(p);
      Gia_ManSetPhase(p);
      iVar1 = Gia_ManObjNum(p);
      p_local = Gia_ManStart(iVar1);
      pcVar5 = Abc_UtilStrsav(p->pName);
      p_local->pName = pcVar5;
      pcVar5 = Abc_UtilStrsav(p->pSpec);
      p_local->pSpec = pcVar5;
      Gia_ManFillValue(p);
      pGVar6 = Gia_ManConst0(p);
      pGVar6->Value = 0;
      pMap._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar7 = false;
        if (pMap._4_4_ < iVar1) {
          pGStack_30 = Gia_ManCi(p,pMap._4_4_);
          bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = Gia_ManAppendCi(p_local);
        pGStack_30->Value = uVar2;
        pMap._4_4_ = pMap._4_4_ + 1;
      }
      Gia_ManHashAlloc(p_local);
      pMap._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if (pMap._4_4_ < iVar1) {
          pGStack_30 = Gia_ManCo(p,pMap._4_4_);
          bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        pGVar6 = Gia_ObjFanin0(pGStack_30);
        Gia_ManEquivReduce2_rec(p_local,p,pGVar6,vMap_00,1);
        pMap._4_4_ = pMap._4_4_ + 1;
      }
      pMap._4_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if (pMap._4_4_ < iVar1) {
          pGStack_30 = Gia_ManCo(p,pMap._4_4_);
          bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjFanin0Copy(pGStack_30);
        uVar2 = Gia_ManAppendCo(p_local,iVar1);
        pGStack_30->Value = uVar2;
        pMap._4_4_ = pMap._4_4_ + 1;
      }
      Gia_ManHashStop(p_local);
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_local,iVar1);
      Vec_IntFree(vMap_00);
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce2( Gia_Man_t * p )
{
    Vec_Int_t * vMap;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
        return Gia_ManDup( p );
    vMap = Gia_ManChoiceMinLevel( p );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce2_rec( pNew, p, Gia_ObjFanin0(pObj), vMap, 1 );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vMap );
    return pNew;
}